

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Vrc6_Apu.cpp
# Opt level: O0

void __thiscall Nes_Vrc6_Apu::run_square(Nes_Vrc6_Apu *this,Vrc6_Osc *osc,blip_time_t end_time)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int in_EDX;
  Vrc6_Osc *in_RSI;
  long in_RDI;
  int phase;
  int period;
  blip_time_t time;
  int delta;
  int duty;
  int gate;
  int volume;
  Blip_Buffer *output;
  int in_stack_ffffffffffffffa8;
  blip_time_t in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  uint uVar4;
  int local_3c;
  int local_34;
  uint local_24;
  
  if (in_RSI->output != (Blip_Buffer *)0x0) {
    Blip_Buffer::set_modified(in_RSI->output);
    local_24 = in_RSI->regs[0] & 0xf;
    if ((in_RSI->regs[2] & 0x80) == 0) {
      local_24 = 0;
    }
    bVar1 = in_RSI->regs[0];
    iVar2 = ((int)(uint)in_RSI->regs[0] >> 4 & 7U) + 1;
    uVar4 = local_24;
    if (((bVar1 & 0x80) == 0) && (iVar2 <= in_RSI->phase)) {
      uVar4 = 0;
    }
    iVar3 = uVar4 - in_RSI->last_amp;
    local_34 = *(int *)(in_RDI + 0x60);
    if (iVar3 != 0) {
      in_RSI->last_amp = iVar3 + in_RSI->last_amp;
      Blip_Synth<12,_1>::offset
                ((Blip_Synth<12,_1> *)CONCAT44(uVar4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,(Blip_Buffer *)0x82edb8);
    }
    local_34 = in_RSI->delay + local_34;
    in_RSI->delay = 0;
    iVar3 = Vrc6_Osc::period(in_RSI);
    if (((local_24 != 0) && ((bVar1 & 0x80) == 0)) && (4 < iVar3)) {
      if (local_34 < in_EDX) {
        local_3c = in_RSI->phase;
        do {
          local_3c = local_3c + 1;
          if (local_3c == 0x10) {
            local_3c = 0;
            in_RSI->last_amp = local_24;
            Blip_Synth<12,_1>::offset
                      ((Blip_Synth<12,_1> *)CONCAT44(uVar4,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,(Blip_Buffer *)0x82ee61);
          }
          if (local_3c == iVar2) {
            in_RSI->last_amp = 0;
            Blip_Synth<12,_1>::offset
                      ((Blip_Synth<12,_1> *)CONCAT44(uVar4,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,(Blip_Buffer *)0x82ee97);
          }
          local_34 = iVar3 + local_34;
        } while (local_34 < in_EDX);
        in_RSI->phase = local_3c;
      }
      in_RSI->delay = local_34 - in_EDX;
    }
  }
  return;
}

Assistant:

void Nes_Vrc6_Apu::run_square( Vrc6_Osc& osc, blip_time_t end_time )
{
	Blip_Buffer* output = osc.output;
	if ( !output )
		return;
	output->set_modified();
	
	int volume = osc.regs [0] & 15;
	if ( !(osc.regs [2] & 0x80) )
		volume = 0;
	
	int gate = osc.regs [0] & 0x80;
	int duty = ((osc.regs [0] >> 4) & 7) + 1;
	int delta = ((gate || osc.phase < duty) ? volume : 0) - osc.last_amp;
	blip_time_t time = last_time;
	if ( delta )
	{
		osc.last_amp += delta;
		square_synth.offset( time, delta, output );
	}
	
	time += osc.delay;
	osc.delay = 0;
	int period = osc.period();
	if ( volume && !gate && period > 4 )
	{
		if ( time < end_time )
		{
			int phase = osc.phase;
			
			do
			{
				phase++;
				if ( phase == 16 )
				{
					phase = 0;
					osc.last_amp = volume;
					square_synth.offset( time, volume, output );
				}
				if ( phase == duty )
				{
					osc.last_amp = 0;
					square_synth.offset( time, -volume, output );
				}
				time += period;
			}
			while ( time < end_time );
			
			osc.phase = phase;
		}
		osc.delay = time - end_time;
	}
}